

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create_ghosts(int type,int ndim,int *dims,int *width,char *name,int *chunk)

{
  ulong uVar1;
  Integer *chunk_00;
  logical lVar2;
  int iVar3;
  ulong uVar4;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  Integer local_d0 [9];
  Integer local_88 [7];
  long lStack_50;
  Integer local_48 [8];
  
  iVar3 = 0;
  if (ndim < 8) {
    uVar4 = (ulong)(uint)ndim;
    uVar1 = uVar4;
    if (0 < ndim) {
      do {
        (&lStack_50)[uVar1] = (long)*dims;
        dims = dims + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      uVar1 = uVar4;
      if (0 < ndim) {
        do {
          local_d0[uVar1] = (long)*width;
          width = width + 1;
          uVar1 = uVar1 - 1;
        } while (uVar1 != 0);
      }
    }
    chunk_00 = local_88;
    if (chunk == (int *)0x0) {
      chunk_00 = (Integer *)0x0;
    }
    if (chunk != (int *)0x0 && 0 < ndim) {
      do {
        uVar4 = uVar4 - 1;
        local_88[uVar4] = (long)*chunk;
        chunk = chunk + 1;
        chunk_00 = local_88;
      } while (uVar4 != 0);
    }
    lVar2 = pnga_create_ghosts((long)type,(long)ndim,local_48,local_d0 + 1,name,chunk_00,local_d0);
    iVar3 = 0;
    if (lVar2 == 1) {
      iVar3 = (int)local_d0[0];
    }
  }
  return iVar3;
}

Assistant:

int NGA_Create_ghosts(int type, int ndim,int dims[], int width[], char *name,
    int chunk[])
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(width,_ga_width, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create_ghosts((Integer)type, (Integer)ndim, _ga_dims,
        _ga_width, name, ptr, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}